

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tobinary.cpp
# Opt level: O2

void checkOptions(Options *opts)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  string *__return_storage_ptr__;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_50,"author=b",&local_51);
  std::__cxx11::string::string((string *)&local_30,"Author of the program",&local_52);
  smf::Options::define(opts,&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"version=b",&local_51);
  std::__cxx11::string::string((string *)&local_30,"Version of the program",&local_52);
  smf::Options::define(opts,&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"example=b",&local_51);
  std::__cxx11::string::string((string *)&local_30,"Example useage of the program",&local_52);
  smf::Options::define(opts,&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"h|help=b",&local_51);
  std::__cxx11::string::string((string *)&local_30,"List of options for the program",&local_52);
  smf::Options::define(opts,&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  smf::Options::process(opts,1,0);
  std::__cxx11::string::string((string *)&local_50,"author",(allocator *)&local_30);
  bVar1 = smf::Options::getBoolean(opts,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    pcVar4 = "craig@ccrma.stanford.edu, February 2015";
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"version",(allocator *)&local_30);
    bVar1 = smf::Options::getBoolean(opts,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_50,"help",(allocator *)&local_30);
      bVar1 = smf::Options::getBoolean(opts,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        __return_storage_ptr__ = &local_50;
        smf::Options::getCommand_abi_cxx11_(__return_storage_ptr__,opts);
        usage(__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        std::__cxx11::string::string((string *)&local_50,"example",(allocator *)&local_30);
        bVar1 = smf::Options::getBoolean(opts,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (!bVar1) {
          iVar2 = smf::Options::getArgCount(opts);
          if (iVar2 < 3) {
            iVar2 = smf::Options::getArgCount(opts);
            if (iVar2 != 0) {
              return;
            }
            pcVar4 = "Error: Too few filenames given.";
          }
          else {
            pcVar4 = "Error: Too many filenames given.";
          }
          poVar3 = std::operator<<((ostream *)&std::cerr,pcVar4);
          std::endl<char,std::char_traits<char>>(poVar3);
          exit(1);
        }
        example();
      }
      goto LAB_00116d4b;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"tobinary, version 1.0 (18 Feb 2015)\n");
    poVar3 = std::operator<<(poVar3,"compiled: ");
    pcVar4 = "Apr 26 2025";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
LAB_00116d4b:
  exit(0);
}

Assistant:

void checkOptions(Options& opts) {
	opts.define("author=b",   "Author of the program");
	opts.define("version=b",  "Version of the program");
	opts.define("example=b",  "Example useage of the program");
	opts.define("h|help=b",   "List of options for the program");
	opts.process();

	if (opts.getBoolean("author")) {
		cout << "Written by Craig Stuart Sapp, "
		     << "craig@ccrma.stanford.edu, February 2015" << endl;
		exit(0);
	} else if (opts.getBoolean("version")) {
		cout << "tobinary, version 1.0 (18 Feb 2015)\n"
		     << "compiled: " << __DATE__ << endl;
		exit(0);
	} else if (opts.getBoolean("help")) {
		usage(opts.getCommand());
		exit(0);
	} else if (opts.getBoolean("example")) {
		example();
		exit(0);
	}

	if (opts.getArgCount() > 2) {
		cerr << "Error: Too many filenames given." << endl;
		exit(1);
	}
	if (opts.getArgCount() == 0) {
		cerr << "Error: Too few filenames given." << endl;
		exit(1);
	}

}